

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O2

void __thiscall
KDReports::AutoTableElementPrivate::createHorizontalHeader
          (AutoTableElementPrivate *this,ReportBuilder *builder,QTextDocument *textDoc,
          QTextTable *textTable,int columns,int headerColumnCount)

{
  int __args;
  QTextTableCellFormat tableHeaderFormat;
  QTextTableCell cell;
  
  if (this->m_horizontalHeaderVisible == true) {
    __args = 0;
    if (columns < 1) {
      columns = 0;
    }
    for (; columns != __args; __args = __args + 1) {
      QTextTable::cellAt((int)(QTextCharFormat *)&cell,(int)textTable);
      if (_cell == 0) {
        qt_assert("cell.isValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsAutoTableElement.cpp"
                  ,0xff);
      }
      QTextTableCellFormat::QTextTableCellFormat(&tableHeaderFormat);
      QTextFormat::setBackground((QTextFormat *)&tableHeaderFormat,&this->m_headerBackground);
      if ((this->m_horizontalHeaderFormatFunc).super__Function_base._M_manager != (_Manager_type)0x0
         ) {
        std::function<void_(int,_QTextTableCellFormat_&)>::operator()
                  (&this->m_horizontalHeaderFormatFunc,__args,&tableHeaderFormat);
      }
      QTextTableCell::setFormat((QTextCharFormat *)&cell);
      fillCellFromHeaderData(this,__args,Horizontal,&cell,textDoc,textTable,builder);
      QTextFormat::~QTextFormat((QTextFormat *)&tableHeaderFormat);
    }
  }
  return;
}

Assistant:

void KDReports::AutoTableElementPrivate::createHorizontalHeader(ReportBuilder &builder, QTextDocument &textDoc, QTextTable *textTable, int columns, int headerColumnCount) const
{
    if (m_horizontalHeaderVisible) {
        for (int column = 0; column < columns; column++) {
            QTextTableCell cell = textTable->cellAt(0, column + headerColumnCount);
            Q_ASSERT(cell.isValid());
            QTextTableCellFormat tableHeaderFormat;
            tableHeaderFormat.setBackground(m_headerBackground);
            if (m_horizontalHeaderFormatFunc)
                m_horizontalHeaderFormatFunc(column, tableHeaderFormat);
            cell.setFormat(tableHeaderFormat);
            fillCellFromHeaderData(column, Qt::Horizontal, cell, textDoc, textTable, builder);
        }
    }
}